

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

SExpression __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration
          (LoopPeelingInfo *this,SERecurrentNode *rec,int64_t iteration)

{
  ScalarEvolutionAnalysis *this_00;
  SENode *pSVar1;
  SENode *pSVar2;
  SENode *pSVar3;
  SExpression SVar4;
  
  pSVar2 = rec->coefficient_;
  pSVar1 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar2->parent_analysis_,pSVar2);
  this_00 = pSVar2->parent_analysis_;
  pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(rec->offset_->parent_analysis_,rec->offset_);
  pSVar3 = ScalarEvolutionAnalysis::CreateConstant(this_00,iteration);
  pSVar1 = ScalarEvolutionAnalysis::CreateMultiplyNode(this_00,pSVar1,pSVar3);
  pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1->parent_analysis_,pSVar1);
  pSVar2 = ScalarEvolutionAnalysis::CreateAddNode(pSVar1->parent_analysis_,pSVar3,pSVar2);
  SVar4.node_ = ScalarEvolutionAnalysis::SimplifyExpression(pSVar2->parent_analysis_,pSVar2);
  SVar4.scev_ = pSVar2->parent_analysis_;
  return SVar4;
}

Assistant:

SExpression LoopPeelingPass::LoopPeelingInfo::GetValueAtIteration(
    SERecurrentNode* rec, int64_t iteration) const {
  SExpression coeff = rec->GetCoefficient();
  SExpression offset = rec->GetOffset();

  return (coeff * iteration) + offset;
}